

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryOutputWindow.cpp
# Opt level: O1

void __thiscall QueryOutputWindow::QueryOutputWindow(QueryOutputWindow *this)

{
  WINDOW *pWVar1;
  int height;
  
  (this->super_IWindow)._vptr_IWindow = (_func_int **)&PTR__QueryOutputWindow_00108cf0;
  (this->buffer).super__Vector_base<QueryOutputMessage_*,_std::allocator<QueryOutputMessage_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<QueryOutputMessage_*,_std::allocator<QueryOutputMessage_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer).super__Vector_base<QueryOutputMessage_*,_std::allocator<QueryOutputMessage_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->resultBuffer).super__Vector_base<IResult_*,_std::allocator<IResult_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resultBuffer).super__Vector_base<IResult_*,_std::allocator<IResult_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->resultBuffer).super__Vector_base<IResult_*,_std::allocator<IResult_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  height = _LINES + -4;
  pWVar1 = (WINDOW *)newwin(height,_COLS,0,0);
  (this->super_IWindow).window = pWVar1;
  IWindow::resize(&this->super_IWindow,0,height);
  this->lineCounter = 0;
  init_pair(1,7,0);
  wbkgd((this->super_IWindow).window,0x100);
  return;
}

Assistant:

QueryOutputWindow::QueryOutputWindow()
{
	this->resize(0, LINES - 4);
	this->lineCounter = 0;

	init_pair(COLOUR_SCHEME_OUTPUT, COLOUR_SCHEME_SECONDARY, COLOUR_SCHEME_PRIMARY);
	wbkgd(this->window, COLOR_PAIR(COLOUR_SCHEME_OUTPUT));
}